

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCipher.cpp
# Opt level: O1

void __thiscall security::SimpleCipher::Initialize(SimpleCipher *this,uint64_t encryptionKey)

{
  ulong uVar1;
  
  *(uint64_t *)this->ExpandedKey = encryptionKey;
  uVar1 = (encryptionKey & 0xffffffff) * 0xe7988061;
  this->ExpandedKey[2] = (uint)(uVar1 >> 0x13) ^ (uint)uVar1;
  uVar1 = (encryptionKey >> 0x20) * 0xbd9fa5c7;
  this->ExpandedKey[3] = (uint)(uVar1 >> 0x13) ^ (uint)uVar1;
  return;
}

Assistant:

void SimpleCipher::Initialize(uint64_t encryptionKey)
{
    // Expand connection key to four 32-bit words:

    static const uint32_t q0 = 0xe7988061;
    static const uint32_t q1 = 0xbd9fa5c7;

    ExpandedKey[0] = (uint32_t)encryptionKey;
    ExpandedKey[1] = (uint32_t)(encryptionKey >> 32);
    ExpandedKey[2] = MultiplyAndFold19(q0, ExpandedKey[0]);
    ExpandedKey[3] = MultiplyAndFold19(q1, ExpandedKey[1]);
}